

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool copyFileIfNewer(QString *sourceFileName,QString *destinationFileName,Options *options,
                    bool forceOverwrite)

{
  FILE *pFVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QFileInfo destinationFileInfo;
  QFileInfo sourceFileInfo;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QFileInfo local_48 [8];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::emplaceBack<QString_const&>(&dependenciesForDepfile,sourceFileName);
  cVar3 = QFile::exists((QString *)destinationFileName);
  if (cVar3 != '\0') {
    local_80.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_80,(QString *)destinationFileName);
    local_40 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_40,(QString *)sourceFileName);
    if (forceOverwrite) {
LAB_0010b2d8:
      QFile::QFile((QFile *)&local_68,(QString *)destinationFileName);
      bVar5 = QFile::remove();
      QFile::~QFile((QFile *)&local_68);
      pFVar1 = _stderr;
      if (bVar5 == 0) {
        QString::toLocal8Bit((QByteArray *)&local_68,destinationFileName);
        pcVar6 = local_68.ptr;
        if (local_68.ptr == (char16_t *)0x0) {
          pcVar6 = (char16_t *)&QByteArray::_empty;
        }
        fprintf(pFVar1,"Can\'t remove old file: %s\n",pcVar6);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
        bVar2 = 0;
LAB_0010b4d4:
        bVar5 = bVar2;
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
    }
    else {
      QFileInfo::lastModified((QFileInfo *)&local_68);
      QFileInfo::lastModified(local_48);
      bVar4 = operator<=((QDateTime *)&local_68,(QDateTime *)local_48);
      if (!bVar4) {
        QDateTime::~QDateTime((QDateTime *)local_48);
        QDateTime::~QDateTime((QDateTime *)&local_68);
        goto LAB_0010b2d8;
      }
      bVar4 = alwaysOverwritableFile(destinationFileName);
      QDateTime::~QDateTime((QDateTime *)local_48);
      QDateTime::~QDateTime((QDateTime *)&local_68);
      pFVar1 = _stdout;
      if (bVar4) goto LAB_0010b2d8;
      bVar5 = 1;
      bVar2 = 1;
      if (options->verbose != true) goto LAB_0010b4d4;
      QString::toLocal8Bit((QByteArray *)&local_68,sourceFileName);
      pcVar6 = local_68.ptr;
      if (local_68.ptr == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QByteArray::_empty;
      }
      bVar4 = false;
      fprintf(pFVar1,"  -- Skipping file %s. Same or newer file already in place.\n",pcVar6);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_40);
    QFileInfo::~QFileInfo((QFileInfo *)&local_80);
    if (!bVar4) goto LAB_0010b420;
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QDir::QDir((QDir *)&local_40,(QString *)&local_68);
  QFileInfo::QFileInfo(local_48,(QString *)destinationFileName);
  QFileInfo::path();
  cVar3 = QDir::mkpath((QDir *)&local_40,&local_80,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QFileInfo::~QFileInfo(local_48);
  QDir::~QDir((QDir *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  pFVar1 = _stderr;
  if (cVar3 == '\0') {
    QString::toLocal8Bit((QByteArray *)&local_68,destinationFileName);
    pcVar6 = local_68.ptr;
    if (local_68.ptr == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(pFVar1,"Cannot make output directory for %s.\n",pcVar6);
LAB_0010b546:
    bVar5 = 0;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  }
  else {
    cVar3 = QFile::exists((QString *)destinationFileName);
    if (cVar3 == '\0') {
      cVar3 = QFile::copy((QString *)sourceFileName,(QString *)destinationFileName);
      pFVar1 = _stderr;
      if (cVar3 == '\0') {
        QString::toLocal8Bit((QByteArray *)&local_68,sourceFileName);
        pcVar6 = local_68.ptr;
        if (local_68.ptr == (char16_t *)0x0) {
          pcVar6 = (char16_t *)&QByteArray::_empty;
        }
        QString::toLocal8Bit((QByteArray *)&local_80,destinationFileName);
        if (local_80.ptr == (char16_t *)0x0) {
          local_80.ptr = (char16_t *)&QByteArray::_empty;
        }
        fprintf(pFVar1,"Failed to copy %s to %s.\n",pcVar6,local_80.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_80);
        goto LAB_0010b546;
      }
    }
    pFVar1 = _stdout;
    bVar5 = 1;
    if (options->verbose == true) {
      QString::toLocal8Bit((QByteArray *)&local_68,destinationFileName);
      pcVar6 = local_68.ptr;
      if (local_68.ptr == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar1,"  -- Copied %s\n",pcVar6);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
      fflush(_stdout);
    }
  }
LAB_0010b420:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool copyFileIfNewer(const QString &sourceFileName,
                     const QString &destinationFileName,
                     const Options &options,
                     bool forceOverwrite = false)
{
    dependenciesForDepfile << sourceFileName;
    if (QFile::exists(destinationFileName)) {
        QFileInfo destinationFileInfo(destinationFileName);
        QFileInfo sourceFileInfo(sourceFileName);

        if (!forceOverwrite
                && sourceFileInfo.lastModified() <= destinationFileInfo.lastModified()
                && !alwaysOverwritableFile(destinationFileName)) {
            if (options.verbose)
                fprintf(stdout, "  -- Skipping file %s. Same or newer file already in place.\n", qPrintable(sourceFileName));
            return true;
        } else {
            if (!QFile(destinationFileName).remove()) {
                fprintf(stderr, "Can't remove old file: %s\n", qPrintable(destinationFileName));
                return false;
            }
        }
    }

    if (!QDir().mkpath(QFileInfo(destinationFileName).path())) {
        fprintf(stderr, "Cannot make output directory for %s.\n", qPrintable(destinationFileName));
        return false;
    }

    if (!QFile::exists(destinationFileName) && !QFile::copy(sourceFileName, destinationFileName)) {
        fprintf(stderr, "Failed to copy %s to %s.\n", qPrintable(sourceFileName), qPrintable(destinationFileName));
        return false;
    } else if (options.verbose) {
        fprintf(stdout, "  -- Copied %s\n", qPrintable(destinationFileName));
        fflush(stdout);
    }
    return true;
}